

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass_table.hpp
# Opt level: O3

bool __thiscall squall::KlassTable::find_klass_object<Foo2>(KlassTable *this,HSQOBJECT *obj)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  SQObjectType SVar2;
  iterator iVar3;
  SQTable *extraout_RDX;
  size_t h;
  size_t local_28;
  
  local_28 = std::type_info::hash_code((type_info *)&detail::KlassImp<Foo2>::typeinfo);
  iVar3 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_28);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    plVar1 = *(long **)((long)iVar3.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
                              ._M_cur + 0x10);
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)iVar3.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
                      ._M_cur + 0x18);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    (**(code **)(*plVar1 + 0x10))(plVar1);
    SVar2 = (**(code **)(*plVar1 + 0x18))(plVar1);
    obj->_type = SVar2;
    (obj->_unVal).pTable = extraout_RDX;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return iVar3.
         super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool find_klass_object(HSQOBJECT& obj) {
        typedef typename std::remove_cv<C>::type CC;
        size_t h = detail::KlassImp<CC>::hash();
        auto i = klasses_.find(h);
        if (i == klasses_.end()) {
            return false;
        } else {
            auto p = (*i).second;
            p->close();
            obj = p->get_klass_object();
            return true;
        }
    }